

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O2

void __thiscall Array<String>::reserve(Array<String> *this,usize size)

{
  String *pSVar1;
  String *pSVar2;
  String *this_00;
  String *src;
  String *pSVar3;
  
  pSVar3 = (this->_begin).item;
  if (size <= this->_capacity) {
    if (size == 0 || pSVar3 != (String *)0x0) {
      return;
    }
    pSVar3 = (String *)0x0;
    size = this->_capacity;
  }
  this->_capacity = size | 3;
  pSVar2 = (String *)operator_new__((size | 3) * 0x28);
  this_00 = pSVar2;
  if (pSVar3 != (String *)0x0) {
    pSVar1 = (this->_end).item;
    for (; pSVar3 != pSVar1; pSVar3 = pSVar3 + 1) {
      String::String(this_00,pSVar3);
      String::~String(pSVar3);
      this_00 = this_00 + 1;
    }
    pSVar3 = (this->_begin).item;
    if (pSVar3 != (String *)0x0) {
      operator_delete__(pSVar3);
    }
  }
  (this->_begin).item = pSVar2;
  (this->_end).item = this_00;
  return;
}

Assistant:

void reserve(usize size)
  {
    if(size > _capacity || (!_begin.item && size > 0))
    {
      if (size > _capacity)
        _capacity = size;
      _capacity |= 0x03;
      T* newData = (T*)new char[sizeof(T) * _capacity];
      T* dest = newData;
      if(_begin.item)
      {
        for (T* src = _begin.item, * end = _end.item; src != end; ++src, ++dest)
        {
#ifdef VERIFY
          VERIFY(new(dest)T(*src) == dest);
#else
          new(dest)T(*src);
#endif
          src->~T();
        }
        delete[] (char*)_begin.item;
      }
      _begin.item = newData;
      _end.item = dest;
    }
  }